

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_72e95::testUInt(void)

{
  ErrorCode EVar1;
  ostream *poVar2;
  Value local_78;
  undefined4 local_50;
  uint local_3c;
  undefined1 local_38 [4];
  uint i;
  Value v;
  
  Json::Value::Value((Value *)local_38,2);
  local_3c = 0;
  EVar1 = std::function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>::
          operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                      *)(anonymous_namespace)::UIntHelper,&local_3c,(Value *)local_38);
  if (EVar1 == Success) {
    if (local_3c == 2) {
      local_3c = 0;
      Json::Value::Value(&local_78,nullValue);
      Json::Value::operator=((Value *)local_38,&local_78);
      Json::Value::~Value(&local_78);
      EVar1 = std::function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
              ::operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::UIntHelper,&local_3c,(Value *)local_38);
      if (EVar1 == InvalidInt) {
        local_3c = 0;
        EVar1 = std::
                function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>::
                operator()((function<(anonymous_namespace)::ErrorCode_(unsigned_int_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::UIntHelper,&local_3c,(Value *)0x0);
        if (EVar1 == Success) {
          if (local_3c == 1) {
            v.limit_._7_1_ = 1;
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x69);
            std::operator<<(poVar2,"\n");
            v.limit_._7_1_ = 0;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(UIntHelper(i, nullptr) == ErrorCode::Success) failed on line "
                                  );
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x68);
          std::operator<<(poVar2,"\n");
          v.limit_._7_1_ = 0;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                                );
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x65);
        std::operator<<(poVar2,"\n");
        v.limit_._7_1_ = 0;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x61);
      std::operator<<(poVar2,"\n");
      v.limit_._7_1_ = 0;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::Success) failed on line ")
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x60);
    std::operator<<(poVar2,"\n");
    v.limit_._7_1_ = 0;
  }
  local_50 = 1;
  Json::Value::~Value((Value *)local_38);
  return (bool)(v.limit_._7_1_ & 1);
}

Assistant:

bool testUInt()
{
  Json::Value v(2);
  unsigned int i = 0;
  ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::Success);
  ASSERT_TRUE(i == 2);

  i = 0;
  v = Json::nullValue;
  ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::InvalidInt);

  i = 0;
  ASSERT_TRUE(UIntHelper(i, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(i == 1);

  return true;
}